

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Secp256k1::SignWhitelistSecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *offline_pubkey,
          ByteData256 *online_privkey,ByteData256 *tweak_sum,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *online_keys,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *offline_keys,
          uint32_t whitelist_index)

{
  void *pvVar1;
  pointer pBVar2;
  pointer pBVar3;
  undefined8 uVar4;
  pointer paVar5;
  ByteData *this_00;
  pointer paVar6;
  size_t sVar7;
  long lVar8;
  pointer __s;
  CfdException *pCVar9;
  size_type __new_size;
  ulong uVar10;
  value_type_conflict1 *__val;
  int ret;
  size_t outlen;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> online_pubkeys;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> offline_pubkeys;
  secp256k1_pubkey offline_pubkey_secp;
  secp256k1_whitelist_signature signature;
  int local_213c;
  unsigned_long local_2138;
  undefined1 local_2130 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2110;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> local_20f8;
  ByteData *local_20e0;
  ByteData256 *local_20d8;
  ByteData256 *local_20d0;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> local_20c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20b0;
  undefined1 local_2098 [64];
  undefined1 local_2058 [8232];
  
  pvVar1 = this->secp256k1_context_;
  if (pvVar1 == (void *)0x0) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x1fc;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2058,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar7 = ByteData::GetDataSize(offline_pubkey);
  if (sVar7 != 0x21) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x201;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                  "Invalid Argument pubkey size.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2058,"Invalid Pubkey size.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pBVar2 = (online_keys->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3 = (online_keys->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_20d0 = online_privkey;
  if (pBVar2 == pBVar3) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x206;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                  "Invalid Argument online_keys empty.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2058,"Empty online_keys.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar8 = (long)pBVar3 - (long)pBVar2;
  if (0x100 < (ulong)((lVar8 >> 3) * -0x5555555555555555)) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x20b;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                  "Invalid Argument online_keys maximum over.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2058,"Invalid online_keys size over.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_20d8 = tweak_sum;
  if (lVar8 != (long)(offline_keys->
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(offline_keys->
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                     _M_impl.super__Vector_impl_data._M_start) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x210;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                  "Invalid Argument online_keys length.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2058,"Unmatch keylist length.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_20b0,offline_pubkey);
  local_213c = secp256k1_ec_pubkey_parse
                         (pvVar1,local_2098,
                          local_20b0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_20b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_20b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  if (local_213c != 1) {
    local_2058._0_8_ = "cfdcore_secp256k1.cpp";
    local_2058._8_4_ = 0x21d;
    local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                      "secp256k1_ec_pubkey_parse offline_pubkey Error.({})",&local_213c);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2058._0_8_ = local_2058 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2058,"Secp256k1 offline_pubkey parse Error.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&local_20f8,
             ((long)(online_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(online_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_2058);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&local_20c8,
             ((long)(offline_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(offline_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_2058);
  local_2138 = 0;
  local_20e0 = __return_storage_ptr__;
  if (local_20f8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_20f8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
  }
  else {
    do {
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130,
                         (online_keys->
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_2138);
      local_213c = secp256k1_ec_pubkey_parse
                             (pvVar1,local_20f8.
                                     super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_2138,
                              local_2130._0_8_,
                              CONCAT44(local_2130._12_4_,local_2130._8_4_) - local_2130._0_8_);
      if (local_213c != 1) {
        local_2058._0_8_ = "cfdcore_secp256k1.cpp";
        local_2058._8_4_ = 0x22d;
        local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
        logger::log<unsigned_long&,int&>
                  ((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                   "secp256k1_ec_pubkey_parse onlines[{}] Error.({})",&local_2138,&local_213c);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_2058._0_8_ = local_2058 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2058,"Secp256k1 onlines pubkey parse Error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::GetBytes(&local_2110,
                         (offline_keys->
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_2138);
      local_213c = secp256k1_ec_pubkey_parse
                             (pvVar1,local_20c8.
                                     super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_2138,
                              local_2110.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2110.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2110.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      if (local_213c != 1) {
        local_2058._0_8_ = "cfdcore_secp256k1.cpp";
        local_2058._8_4_ = 0x23a;
        local_2058._16_8_ = "SignWhitelistSecp256k1Ec";
        logger::log<unsigned_long&,int&>
                  ((CfdSourceLocation *)local_2058,kCfdLogLevelWarning,
                   "secp256k1_ec_pubkey_parse offlines[{}] Error.({})",&local_2138,&local_213c);
        pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
        local_2058._0_8_ = local_2058 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2058,"Secp256k1 offlines pubkey parse Error.","");
        CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2058);
        __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2130._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2130._0_8_);
      }
      local_2138 = local_2138 + 1;
      uVar10 = (long)local_20f8.
                     super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_20f8.
                     super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl
                     .super__Vector_impl_data._M_start >> 6;
    } while (local_2138 < uVar10);
  }
  paVar6 = local_20c8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  paVar5 = local_20f8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130,local_20d0);
  this_00 = local_20e0;
  uVar4 = local_2130._0_8_;
  ByteData256::GetBytes(&local_2110,local_20d8);
  local_213c = secp256k1_whitelist_sign
                         (pvVar1,local_2058,paVar5,paVar6,uVar10,local_2098,uVar4,
                          local_2110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,whitelist_index,0,0);
  if (local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_2130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2130._0_8_);
  }
  if (local_213c != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x249;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_2130,kCfdLogLevelWarning,
                      "secp256k1_whitelist_sign Error.({})",&local_213c);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2130._0_8_ = local_2130 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2130,"Secp256k1 whitelist sign Error.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_213c = secp256k1_whitelist_verify
                         (pvVar1,local_2058,
                          local_20f8.
                          super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          local_20c8.
                          super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_20f8.
                                super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_20f8.
                                super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 6,local_2098);
  if (local_213c != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x252;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_2130,kCfdLogLevelWarning,
                      "secp256k1_whitelist_verify Error.({})",&local_213c);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2130._0_8_ = local_2130 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2130,"Secp256k1 whitelist verify Error.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  __s = (pointer)operator_new(0x2021);
  local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x2021;
  memset(__s,0,0x2021);
  __new_size = ((long)local_20f8.
                      super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_20f8.
                      super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 1) + 0x21;
  local_2138 = __new_size;
  local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x2021;
  local_213c = secp256k1_whitelist_signature_serialize(pvVar1,__s,&local_2138,local_2058);
  if (local_213c != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x25f;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_2130,kCfdLogLevelWarning,
                      "secp256k1_whitelist_signature_serialize Error.({})",&local_213c);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2130._0_8_ = local_2130 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2130,"Secp256k1 whitelist signature serialize Error.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_2138 != __new_size) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x267;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_2130,kCfdLogLevelWarning,
               "secp256k1_whitelist_signature_serialize size Error.({})",&local_2138);
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2130._0_8_ = local_2130 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2130,"Secp256k1 whitelist signature serialize size Error.","");
    CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar9,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2110,__new_size);
  ByteData::ByteData(this_00,&local_2110);
  if (local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_20c8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20c8.
                    super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20f8.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20f8.
                    super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_20b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

ByteData Secp256k1::SignWhitelistSecp256k1Ec(
    const ByteData& offline_pubkey, const ByteData256& online_privkey,
    const ByteData256& tweak_sum, const std::vector<ByteData>& online_keys,
    const std::vector<ByteData>& offline_keys, uint32_t whitelist_index) {
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPrivkeySize = 32;
  static constexpr uint32_t kOutputMaxSize =
      1 + (kPrivkeySize * (1 + kWhitelistCountMaximum));
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (offline_pubkey.GetDataSize() != 33) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (online_keys.empty()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty online_keys.");
  }
  if (online_keys.size() > kWhitelistCountMaximum) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys maximum over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid online_keys size over.");
  }
  if (online_keys.size() != offline_keys.size()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys length.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch keylist length.");
  }

  int ret;
  const std::vector<uint8_t>& offline_pubkey_data = offline_pubkey.GetBytes();
  secp256k1_pubkey offline_pubkey_secp;
  ret = secp256k1_ec_pubkey_parse(
      context, &offline_pubkey_secp, offline_pubkey_data.data(),
      offline_pubkey_data.size());
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offline_pubkey Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 offline_pubkey parse Error.");
  }

  std::vector<secp256k1_pubkey> online_pubkeys(online_keys.size());
  std::vector<secp256k1_pubkey> offline_pubkeys(offline_keys.size());
  for (size_t index = 0; index < online_pubkeys.size(); ++index) {
    const std::vector<uint8_t>& online_data = online_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &online_pubkeys[index], online_data.data(),
        online_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse onlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 onlines pubkey parse Error.");
    }

    const std::vector<uint8_t>& offline_data = offline_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &offline_pubkeys[index], offline_data.data(),
        offline_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 offlines pubkey parse Error.");
    }
  }

  secp256k1_whitelist_signature signature;
  ret = secp256k1_whitelist_sign(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp,
      online_privkey.GetBytes().data(), tweak_sum.GetBytes().data(),
      whitelist_index, nullptr, nullptr);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_sign Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 whitelist sign Error.");
  }

  ret = secp256k1_whitelist_verify(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_verify Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist verify Error.");
  }

  std::vector<uint8_t> output(kOutputMaxSize);
  size_t output_size = 1 + (kPrivkeySize * (1 + online_pubkeys.size()));
  size_t outlen = output_size;
  ret = secp256k1_whitelist_signature_serialize(
      context, output.data(), &outlen, &signature);
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_whitelist_signature_serialize Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize Error.");
  }
  if (outlen != output_size) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_whitelist_signature_serialize size Error.({})", outlen);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize size Error.");
  }
  output.resize(output_size);
  return ByteData(output);
}